

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

void hash(void *key,size_t len,uint32_t seed,size_t *r_hash)

{
  long lVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar7 = (uint)len;
  uVar8 = (ulong)seed;
  uVar6 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | len & 0xffffffff) / 0x10;
  lVar5 = 0;
  iVar2 = (int)uVar6;
  uVar10 = 0;
  if (0 < iVar2) {
    uVar10 = uVar6 & 0xffffffff;
  }
  uVar6 = uVar8;
  for (; uVar10 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
    uVar8 = ((ulong)(*(long *)((long)key + lVar5) * -0x783c846eeebdac2b) >> 0x21 |
            *(long *)((long)key + lVar5) * -0x775ed61580000000) * 0x4cf5ad432745937f ^ uVar8;
    lVar1 = *(long *)((long)key + lVar5 + 8);
    lVar9 = (uVar8 << 0x1b | uVar8 >> 0x25) + uVar6;
    uVar6 = ((ulong)(lVar1 * 0x4cf5ad432745937f) >> 0x1f | lVar1 * 0x4e8b26fe00000000) *
            -0x783c846eeebdac2b ^ uVar6;
    uVar8 = lVar9 * 5 + 0x52dce729;
    uVar6 = (lVar9 * 5 + 0x52dce729 + (uVar6 << 0x1f | uVar6 >> 0x21)) * 5 + 0x38495ab5;
  }
  lVar5 = (long)iVar2 * 0x10;
  uVar10 = 0;
  switch(uVar7 & 0xf) {
  case 0xf:
    uVar10 = (ulong)*(byte *)((long)key + lVar5 + 0xe) << 0x30;
  case 0xe:
    uVar10 = uVar10 | (ulong)*(byte *)((long)key + lVar5 + 0xd) << 0x28;
  case 0xd:
    uVar10 = uVar10 ^ (ulong)*(byte *)((long)key + lVar5 + 0xc) << 0x20;
  case 0xc:
    uVar10 = uVar10 ^ (ulong)*(byte *)((long)key + lVar5 + 0xb) << 0x18;
  case 0xb:
    uVar10 = uVar10 ^ (ulong)*(byte *)((long)key + lVar5 + 10) << 0x10;
  case 10:
    uVar10 = uVar10 ^ (ulong)*(byte *)((long)key + lVar5 + 9) << 8;
  case 9:
    uVar10 = *(byte *)((long)key + lVar5 + 8) ^ uVar10;
    uVar6 = uVar6 ^ (uVar10 * 0x4cf5ad432745937f >> 0x1f | uVar10 * 0x4e8b26fe00000000) *
                    -0x783c846eeebdac2b;
  case 8:
    uVar10 = (ulong)*(byte *)((long)key + lVar5 + 7) << 0x38;
  case 7:
    uVar10 = uVar10 | (ulong)*(byte *)((long)key + lVar5 + 6) << 0x30;
  case 6:
    uVar10 = uVar10 ^ (ulong)*(byte *)((long)key + lVar5 + 5) << 0x28;
  case 5:
    uVar10 = uVar10 ^ (ulong)*(byte *)((long)key + lVar5 + 4) << 0x20;
  case 4:
    uVar10 = uVar10 ^ (ulong)*(byte *)((long)key + lVar5 + 3) << 0x18;
  case 3:
    uVar10 = uVar10 ^ (ulong)*(byte *)((long)key + lVar5 + 2) << 0x10;
  case 2:
    uVar10 = uVar10 ^ (ulong)*(byte *)((long)key + lVar5 + 1) << 8;
  case 1:
    uVar10 = *(byte *)((long)key + lVar5) ^ uVar10;
    uVar8 = uVar8 ^ (uVar10 * -0x783c846eeebdac2b >> 0x21 | uVar10 * -0x775ed61580000000) *
                    0x4cf5ad432745937f;
  case 0:
    uVar6 = uVar6 ^ (long)(int)uVar7;
    uVar4 = (uVar8 ^ (long)(int)uVar7) + uVar6;
    uVar3 = hash_fmix_64(uVar4);
    uVar4 = hash_fmix_64(uVar6 + uVar4);
    *r_hash = uVar3 + uVar4;
    r_hash[1] = uVar4 + uVar3 + uVar4;
    return;
  }
}

Assistant:

static inline void
hash(const void *key, size_t len, const uint32_t seed, size_t r_hash[2]) {
	assert(len <= INT_MAX); /* Unfortunate implementation limitation. */

#if (LG_SIZEOF_PTR == 3 && !defined(JEMALLOC_BIG_ENDIAN))
	hash_x64_128(key, (int)len, seed, (uint64_t *)r_hash);
#else
	{
		uint64_t hashes[2];
		hash_x86_128(key, (int)len, seed, hashes);
		r_hash[0] = (size_t)hashes[0];
		r_hash[1] = (size_t)hashes[1];
	}
#endif
}